

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

char * ImAtoi<float>(char *src,float *output)

{
  bool bVar1;
  float local_28;
  float local_20;
  float v;
  int negative;
  float *output_local;
  char *src_local;
  
  output_local = (float *)src;
  if (*src == '-') {
    output_local = (float *)(src + 1);
  }
  if (*(char *)output_local == '+') {
    output_local = (float *)((long)output_local + 1);
  }
  local_20 = 0.0;
  while( true ) {
    bVar1 = false;
    if ('/' < *(char *)output_local) {
      bVar1 = *(char *)output_local < ':';
    }
    if (!bVar1) break;
    local_20 = local_20 * 10.0 + (float)(*(char *)output_local + -0x30);
    output_local = (float *)((long)output_local + 1);
  }
  if (*src == '-') {
    local_28 = -local_20;
  }
  else {
    local_28 = local_20;
  }
  *output = local_28;
  return (char *)output_local;
}

Assistant:

static const char* ImAtoi(const char* src, TYPE* output)
{
    int negative = 0;
    if (*src == '-') { negative = 1; src++; }
    if (*src == '+') { src++; }
    TYPE v = 0;
    while (*src >= '0' && *src <= '9')
        v = (v * 10) + (*src++ - '0');
    *output = negative ? -v : v;
    return src;
}